

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_column_distribution(Integer s_a,Integer iproc,Integer *lo,Integer *hi)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar1 = SPA[s_a + 1000].jdim;
  lVar2 = SPA[s_a + 1000].nprocs;
  lVar3 = (lVar1 * iproc) / lVar2;
  lVar6 = lVar2 * lVar3;
  lVar5 = (lVar3 + -1) * lVar2;
  do {
    lVar4 = lVar6 / lVar1;
    lVar3 = lVar3 + 1;
    lVar6 = lVar6 + lVar2;
    lVar5 = lVar5 + lVar2;
  } while (lVar4 < iproc);
  do {
    lVar6 = lVar5 / lVar1;
    lVar3 = lVar3 + -1;
    lVar5 = lVar5 - lVar2;
  } while (iproc < lVar6);
  *lo = lVar3;
  lVar3 = lVar1;
  if (iproc < lVar2 + -1) {
    lVar3 = (lVar1 * (iproc + 1)) / lVar2;
    lVar6 = lVar2 * lVar3;
    lVar5 = (lVar3 + -1) * lVar2;
    do {
      lVar4 = lVar6 / lVar1;
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + lVar2;
      lVar5 = lVar5 + lVar2;
    } while (lVar4 <= iproc);
    do {
      lVar6 = lVar5 / lVar1;
      lVar3 = lVar3 + -1;
      lVar5 = lVar5 - lVar2;
    } while (iproc + 1 < lVar6);
  }
  *hi = lVar3 + -1;
  return;
}

Assistant:

void pnga_sprs_array_column_distribution(Integer s_a, Integer iproc, Integer *lo,
    Integer *hi)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer nproc = SPA[hdl].nprocs;
  Integer jdim = SPA[hdl].jdim;
  *lo = (SPA[hdl].jdim*iproc)/nproc;
  while (((*lo)*nproc)/jdim < iproc) {
    (*lo)++;
  }
  while (((*lo)*nproc)/jdim > iproc) {
    (*lo)--;
  }
  if (iproc < nproc-1) {
    (*hi) = (jdim*(iproc+1))/nproc;
    while (((*hi)*nproc)/jdim < iproc+1) {
      (*hi)++;
    }
    while (((*hi)*nproc)/jdim > iproc+1) {
      (*hi)--;
    }
    (*hi)--;
  } else {
    *hi = jdim-1;
  }
}